

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int allocateBtreePage(BtShared *pBt,MemPage **ppPage,Pgno *pPgno,Pgno nearby,u8 eMode)

{
  u8 uVar1;
  byte bVar2;
  byte bVar3;
  MemPage *pMVar4;
  Bitvec *p;
  bool bVar5;
  MemPage *pMVar6;
  MemPage **ppPage_00;
  Pgno PVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  byte *pbVar11;
  u8 *puVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  MemPage *pMVar16;
  uint uVar17;
  int iVar18;
  MemPage *pMVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  MemPage *pTrunk;
  u8 eType;
  MemPage *local_60;
  uint local_58;
  uint local_54;
  uint *local_50;
  MemPage *local_48;
  MemPage **local_40;
  uint local_38;
  Pgno local_34;
  
  local_60 = (MemPage *)0x0;
  pMVar4 = pBt->pPage1;
  uVar17 = pBt->nPage;
  uVar20 = *(uint *)(pMVar4->aData + 0x24);
  uVar20 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
  if (uVar20 < uVar17) {
    if (uVar20 == 0) {
      uVar1 = pBt->bDoTruncate;
      iVar8 = sqlite3PagerWrite(pMVar4->pDbPage);
      if (iVar8 == 0) {
        uVar20 = pBt->nPage;
        uVar17 = uVar20 + 1;
        pBt->nPage = uVar17;
        uVar13 = (uint)sqlite3PendingByte / pBt->pageSize;
        if (uVar20 == uVar13) {
          uVar17 = uVar20 + 2;
          pBt->nPage = uVar17;
        }
        uVar20 = (uint)(uVar1 == '\0');
        if (pBt->autoVacuum != '\0') {
          PVar7 = 0;
          if (1 < uVar17) {
            iVar8 = (uVar17 - 2) - (uVar17 - 2) % (pBt->usableSize / 5 + 1);
            PVar7 = iVar8 + (uint)(iVar8 + 1U == uVar13) + 2;
          }
          if (PVar7 == uVar17) {
            local_48 = (MemPage *)0x0;
            iVar8 = btreeGetUnusedPage(pBt,uVar17,&local_48,uVar20);
            pMVar4 = local_48;
            if (iVar8 != 0) {
              return iVar8;
            }
            iVar8 = sqlite3PagerWrite(local_48->pDbPage);
            sqlite3PagerUnrefNotNull(pMVar4->pDbPage);
            if (iVar8 != 0) {
              return iVar8;
            }
            uVar13 = pBt->nPage;
            uVar17 = uVar13 + 1;
            pBt->nPage = uVar17;
            if (uVar13 == (uint)sqlite3PendingByte / pBt->pageSize) {
              uVar17 = uVar13 + 2;
              pBt->nPage = uVar17;
            }
          }
        }
        *(uint *)(pBt->pPage1->aData + 0x1c) =
             uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
        PVar7 = pBt->nPage;
        *pPgno = PVar7;
        iVar8 = btreeGetUnusedPage(pBt,PVar7,ppPage,uVar20);
        if (iVar8 == 0) {
          iVar8 = sqlite3PagerWrite((*ppPage)->pDbPage);
          if (iVar8 == 0) {
            iVar8 = 0;
          }
          else {
            if (*ppPage != (MemPage *)0x0) {
              sqlite3PagerUnrefNotNull((*ppPage)->pDbPage);
            }
            *ppPage = (MemPage *)0x0;
          }
        }
      }
    }
    else {
      local_50 = pPgno;
      local_40 = ppPage;
      local_34 = nearby;
      if (eMode == '\x02') {
        bVar22 = true;
      }
      else if ((eMode == '\x01') && (nearby <= uVar17)) {
        iVar8 = ptrmapGet(pBt,nearby,(u8 *)&local_48,(Pgno *)0x0);
        bVar22 = (char)local_48 == '\x02';
        if (iVar8 != 0) {
          return iVar8;
        }
      }
      else {
        bVar22 = false;
      }
      iVar8 = sqlite3PagerWrite(pMVar4->pDbPage);
      if (iVar8 == 0) {
        uVar13 = uVar20 - 1;
        *(uint *)(pMVar4->aData + 0x24) =
             uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 * 0x1000000
        ;
        local_54 = 0;
        pMVar16 = (MemPage *)0x0;
        do {
          if (pMVar16 == (MemPage *)0x0) {
            puVar12 = pMVar4->aData;
            uVar13 = (uint)puVar12[0x22] << 8 |
                     (uint)puVar12[0x21] << 0x10 | (uint)puVar12[0x20] << 0x18;
            pbVar11 = puVar12 + 0x23;
          }
          else {
            pbVar11 = pMVar16->aData;
            uVar13 = (uint)pbVar11[2] << 8 | (uint)pbVar11[1] << 0x10 | (uint)*pbVar11 << 0x18;
            pbVar11 = pbVar11 + 3;
          }
          uVar13 = *pbVar11 | uVar13;
          if ((uVar17 < uVar13) || (uVar20 < local_54)) {
            iVar8 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11ddd,
                        "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
LAB_00133fcb:
            local_60 = (MemPage *)0x0;
            goto LAB_001340be;
          }
          iVar8 = btreeGetUnusedPage(pBt,uVar13,&local_60,0);
          pMVar19 = local_60;
          if (iVar8 != 0) goto LAB_00133fcb;
          puVar12 = local_60->aData;
          uVar21 = *(uint *)(puVar12 + 4);
          uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                   uVar21 << 0x18;
          if ((bVar22) || (uVar21 != 0)) {
            if ((pBt->usableSize >> 2) - 2 < uVar21) {
              iVar8 = 0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11dfa,
                          "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
              goto LAB_001340b5;
            }
            if (bVar22) {
              if ((uVar13 == local_34) || (eMode == '\x02' && uVar13 < local_34)) {
                *local_50 = uVar13;
                *local_40 = local_60;
                iVar8 = sqlite3PagerWrite(local_60->pDbPage);
                if (iVar8 != 0) goto LAB_001340b5;
                if (uVar21 == 0) {
                  if (pMVar16 == (MemPage *)0x0) {
                    *(undefined4 *)(pMVar4->aData + 0x20) = *(undefined4 *)pMVar19->aData;
                  }
                  else {
                    iVar8 = sqlite3PagerWrite(pMVar16->pDbPage);
                    if (iVar8 != 0) goto LAB_001340b5;
                    *(undefined4 *)pMVar16->aData = *(undefined4 *)pMVar19->aData;
                  }
                }
                else {
                  puVar12 = pMVar19->aData;
                  bVar2 = puVar12[9];
                  bVar3 = puVar12[10];
                  uVar13 = (uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (uint)puVar12[8] << 0x18 |
                           (uint)puVar12[0xb];
                  if (uVar17 < uVar13) {
                    iVar8 = 0xb;
                    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11e1c,
                                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
                    goto LAB_001340b5;
                  }
                  local_58 = (uint)puVar12[8];
                  local_38 = (uint)puVar12[0xb];
                  iVar8 = btreeGetUnusedPage(pBt,uVar13,&local_48,0);
                  pMVar6 = local_48;
                  if (iVar8 != 0) goto LAB_001340b5;
                  iVar8 = sqlite3PagerWrite(local_48->pDbPage);
                  if (iVar8 != 0) {
                    sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
                    goto LAB_001340b5;
                  }
                  *(undefined4 *)pMVar6->aData = *(undefined4 *)pMVar19->aData;
                  uVar13 = uVar21 - 1;
                  *(uint *)(pMVar6->aData + 4) =
                       uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                       uVar13 * 0x1000000;
                  memcpy(pMVar6->aData + 8,pMVar19->aData + 0xc,(ulong)(uVar21 * 4 - 4));
                  sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
                  if (pMVar16 == (MemPage *)0x0) {
                    puVar12 = pMVar4->aData;
                    puVar12[0x20] = (u8)local_58;
                    puVar12[0x21] = bVar2;
                    puVar12[0x22] = bVar3;
                    puVar12 = puVar12 + 0x23;
                  }
                  else {
                    iVar8 = sqlite3PagerWrite(pMVar16->pDbPage);
                    if (iVar8 != 0) goto LAB_001340b5;
                    puVar12 = pMVar16->aData;
                    *puVar12 = (u8)local_58;
                    puVar12[1] = bVar2;
                    puVar12[2] = bVar3;
                    puVar12 = puVar12 + 3;
                  }
                  *puVar12 = (u8)local_38;
                }
                local_60 = (MemPage *)0x0;
                pMVar19 = (MemPage *)0x0;
                bVar5 = false;
                iVar8 = 0;
                goto LAB_00133f36;
              }
            }
            if (uVar21 != 0) {
              uVar13 = 0;
              if (local_34 != 0) {
                uVar13 = 0;
                if (eMode == '\x02') {
                  uVar14 = 8;
                  uVar15 = 0;
                  do {
                    uVar9 = *(uint *)(puVar12 + uVar14);
                    if ((uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                        uVar9 << 0x18) <= local_34) {
                      uVar13 = (uint)uVar15;
                      break;
                    }
                    uVar15 = uVar15 + 1;
                    uVar14 = uVar14 + 4;
                  } while (uVar21 != uVar15);
                }
                else if (uVar21 != 1) {
                  uVar13 = *(uint *)(puVar12 + 8);
                  iVar10 = (uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                           uVar13 << 0x18) - local_34;
                  iVar8 = -iVar10;
                  if (-1 < iVar10) {
                    iVar8 = iVar10;
                  }
                  uVar13 = 0;
                  uVar15 = 1;
                  uVar14 = 0xc;
                  do {
                    uVar9 = *(uint *)(puVar12 + uVar14);
                    iVar18 = (uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                             uVar9 << 0x18) - local_34;
                    iVar10 = -iVar18;
                    if (-1 < iVar18) {
                      iVar10 = iVar18;
                    }
                    if (iVar10 < iVar8) {
                      uVar13 = (uint)uVar15;
                      iVar8 = iVar10;
                    }
                    uVar15 = uVar15 + 1;
                    uVar14 = uVar14 + 4;
                  } while (uVar21 != uVar15);
                }
              }
              uVar14 = uVar13 * 4 + 8;
              uVar9 = *(uint *)(puVar12 + uVar14);
              uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                      uVar9 << 0x18;
              if ((uVar17 < uVar9) || (uVar9 < 2)) {
                iVar8 = 0xb;
                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11e5d,
                            "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
                goto LAB_00133f5f;
              }
              if (((uVar9 == local_34) || (eMode == '\x02' && uVar9 < local_34)) || (!bVar22)) {
                *local_50 = uVar9;
                iVar8 = sqlite3PagerWrite(local_60->pDbPage);
                ppPage_00 = local_40;
                if (iVar8 == 0) {
                  uVar9 = uVar21 - 1;
                  if (uVar13 < uVar9) {
                    *(undefined4 *)(puVar12 + uVar14) = *(undefined4 *)(puVar12 + (uVar21 * 4 + 4));
                  }
                  *(uint *)(puVar12 + 4) =
                       uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                       uVar9 * 0x1000000;
                  uVar13 = *local_50;
                  p = pBt->pHasContent;
                  if (p == (Bitvec *)0x0) {
                    uVar21 = 1;
                  }
                  else {
                    uVar21 = 0;
                    if (uVar13 <= p->iSize) {
                      iVar8 = sqlite3BitvecTestNotNull(p,uVar13);
                      uVar21 = (uint)(iVar8 == 0);
                    }
                  }
                  iVar8 = btreeGetUnusedPage(pBt,uVar13,ppPage_00,uVar21);
                  if ((iVar8 == 0) &&
                     (iVar10 = sqlite3PagerWrite((*ppPage_00)->pDbPage), iVar8 = 0, iVar10 != 0)) {
                    if (*ppPage_00 != (MemPage *)0x0) {
                      sqlite3PagerUnrefNotNull((*ppPage_00)->pDbPage);
                    }
                    *ppPage_00 = (MemPage *)0x0;
                    iVar8 = iVar10;
                  }
                  bVar5 = false;
                  goto LAB_00133f36;
                }
                goto LAB_001340b5;
              }
              bVar22 = true;
            }
            iVar8 = 0;
            bVar5 = bVar22;
          }
          else {
            iVar8 = sqlite3PagerWrite(local_60->pDbPage);
            if (iVar8 != 0) goto LAB_001340b5;
            *local_50 = uVar13;
            *(undefined4 *)(pMVar4->aData + 0x20) = *(undefined4 *)pMVar19->aData;
            *local_40 = pMVar19;
            local_60 = (MemPage *)0x0;
            pMVar19 = (MemPage *)0x0;
            iVar8 = 0;
            bVar5 = false;
          }
LAB_00133f36:
          if (pMVar16 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(pMVar16->pDbPage);
          }
          local_54 = local_54 + 1;
          bVar22 = true;
          pMVar16 = pMVar19;
        } while (bVar5);
        pMVar16 = (MemPage *)0x0;
LAB_00133f5f:
        if (pMVar19 != (MemPage *)0x0) {
LAB_001340b5:
          sqlite3PagerUnrefNotNull(pMVar19->pDbPage);
        }
LAB_001340be:
        if (pMVar16 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(pMVar16->pDbPage);
        }
      }
    }
  }
  else {
    iVar8 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11da5,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
  }
  return iVar8;
}

Assistant:

static int allocateBtreePage(
  BtShared *pBt,         /* The btree */
  MemPage **ppPage,      /* Store pointer to the allocated page here */
  Pgno *pPgno,           /* Store the page number here */
  Pgno nearby,           /* Search for a page near this one */
  u8 eMode               /* BTALLOC_EXACT, BTALLOC_LT, or BTALLOC_ANY */
){
  MemPage *pPage1;
  int rc;
  u32 n;     /* Number of pages on the freelist */
  u32 k;     /* Number of leaves on the trunk of the freelist */
  MemPage *pTrunk = 0;
  MemPage *pPrevTrunk = 0;
  Pgno mxPage;     /* Total size of the database file */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( eMode==BTALLOC_ANY || (nearby>0 && IfNotOmitAV(pBt->autoVacuum)) );
  pPage1 = pBt->pPage1;
  mxPage = btreePagecount(pBt);
  /* EVIDENCE-OF: R-05119-02637 The 4-byte big-endian integer at offset 36
  ** stores stores the total number of pages on the freelist. */
  n = get4byte(&pPage1->aData[36]);
  testcase( n==mxPage-1 );
  if( n>=mxPage ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( n>0 ){
    /* There are pages on the freelist.  Reuse one of those pages. */
    Pgno iTrunk;
    u8 searchList = 0; /* If the free-list must be searched for 'nearby' */
    u32 nSearch = 0;   /* Count of the number of search attempts */

    /* If eMode==BTALLOC_EXACT and a query of the pointer-map
    ** shows that the page 'nearby' is somewhere on the free-list, then
    ** the entire-list will be searched for that page.
    */
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( eMode==BTALLOC_EXACT ){
      if( nearby<=mxPage ){
        u8 eType;
        assert( nearby>0 );
        assert( pBt->autoVacuum );
        rc = ptrmapGet(pBt, nearby, &eType, 0);
        if( rc ) return rc;
        if( eType==PTRMAP_FREEPAGE ){
          searchList = 1;
        }
      }
    }else if( eMode==BTALLOC_LE ){
      searchList = 1;
    }
#endif

    /* Decrement the free-list count by 1. Set iTrunk to the index of the
    ** first free-list trunk page. iPrevTrunk is initially 1.
    */
    rc = sqlite3PagerWrite(pPage1->pDbPage);
    if( rc ) return rc;
    put4byte(&pPage1->aData[36], n-1);

    /* The code within this loop is run only once if the 'searchList' variable
    ** is not true. Otherwise, it runs once for each trunk-page on the
    ** free-list until the page 'nearby' is located (eMode==BTALLOC_EXACT)
    ** or until a page less than 'nearby' is located (eMode==BTALLOC_LT)
    */
    do {
      pPrevTrunk = pTrunk;
      if( pPrevTrunk ){
        /* EVIDENCE-OF: R-01506-11053 The first integer on a freelist trunk page
        ** is the page number of the next freelist trunk page in the list or
        ** zero if this is the last freelist trunk page. */
        iTrunk = get4byte(&pPrevTrunk->aData[0]);
      }else{
        /* EVIDENCE-OF: R-59841-13798 The 4-byte big-endian integer at offset 32
        ** stores the page number of the first page of the freelist, or zero if
        ** the freelist is empty. */
        iTrunk = get4byte(&pPage1->aData[32]);
      }
      testcase( iTrunk==mxPage );
      if( iTrunk>mxPage || nSearch++ > n ){
        rc = SQLITE_CORRUPT_PGNO(pPrevTrunk ? pPrevTrunk->pgno : 1);
      }else{
        rc = btreeGetUnusedPage(pBt, iTrunk, &pTrunk, 0);
      }
      if( rc ){
        pTrunk = 0;
        goto end_allocate_page;
      }
      assert( pTrunk!=0 );
      assert( pTrunk->aData!=0 );
      /* EVIDENCE-OF: R-13523-04394 The second integer on a freelist trunk page
      ** is the number of leaf page pointers to follow. */
      k = get4byte(&pTrunk->aData[4]);
      if( k==0 && !searchList ){
        /* The trunk has no leaves and the list is not being searched.
        ** So extract the trunk page itself and use it as the newly
        ** allocated page */
        assert( pPrevTrunk==0 );
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        *pPgno = iTrunk;
        memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
        *ppPage = pTrunk;
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
      }else if( k>(u32)(pBt->usableSize/4 - 2) ){
        /* Value of k is out of range.  Database corruption */
        rc = SQLITE_CORRUPT_PGNO(iTrunk);
        goto end_allocate_page;
#ifndef SQLITE_OMIT_AUTOVACUUM
      }else if( searchList
            && (nearby==iTrunk || (iTrunk<nearby && eMode==BTALLOC_LE))
      ){
        /* The list is being searched and this trunk page is the page
        ** to allocate, regardless of whether it has leaves.
        */
        *pPgno = iTrunk;
        *ppPage = pTrunk;
        searchList = 0;
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        if( k==0 ){
          if( !pPrevTrunk ){
            memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc!=SQLITE_OK ){
              goto end_allocate_page;
            }
            memcpy(&pPrevTrunk->aData[0], &pTrunk->aData[0], 4);
          }
        }else{
          /* The trunk page is required by the caller but it contains
          ** pointers to free-list leaves. The first leaf becomes a trunk
          ** page in this case.
          */
          MemPage *pNewTrunk;
          Pgno iNewTrunk = get4byte(&pTrunk->aData[8]);
          if( iNewTrunk>mxPage ){
            rc = SQLITE_CORRUPT_PGNO(iTrunk);
            goto end_allocate_page;
          }
          testcase( iNewTrunk==mxPage );
          rc = btreeGetUnusedPage(pBt, iNewTrunk, &pNewTrunk, 0);
          if( rc!=SQLITE_OK ){
            goto end_allocate_page;
          }
          rc = sqlite3PagerWrite(pNewTrunk->pDbPage);
          if( rc!=SQLITE_OK ){
            releasePage(pNewTrunk);
            goto end_allocate_page;
          }
          memcpy(&pNewTrunk->aData[0], &pTrunk->aData[0], 4);
          put4byte(&pNewTrunk->aData[4], k-1);
          memcpy(&pNewTrunk->aData[8], &pTrunk->aData[12], (k-1)*4);
          releasePage(pNewTrunk);
          if( !pPrevTrunk ){
            assert( sqlite3PagerIswriteable(pPage1->pDbPage) );
            put4byte(&pPage1->aData[32], iNewTrunk);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc ){
              goto end_allocate_page;
            }
            put4byte(&pPrevTrunk->aData[0], iNewTrunk);
          }
        }
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
#endif
      }else if( k>0 ){
        /* Extract a leaf from the trunk */
        u32 closest;
        Pgno iPage;
        unsigned char *aData = pTrunk->aData;
        if( nearby>0 ){
          u32 i;
          closest = 0;
          if( eMode==BTALLOC_LE ){
            for(i=0; i<k; i++){
              iPage = get4byte(&aData[8+i*4]);
              if( iPage<=nearby ){
                closest = i;
                break;
              }
            }
          }else{
            int dist;
            dist = sqlite3AbsInt32(get4byte(&aData[8]) - nearby);
            for(i=1; i<k; i++){
              int d2 = sqlite3AbsInt32(get4byte(&aData[8+i*4]) - nearby);
              if( d2<dist ){
                closest = i;
                dist = d2;
              }
            }
          }
        }else{
          closest = 0;
        }

        iPage = get4byte(&aData[8+closest*4]);
        testcase( iPage==mxPage );
        if( iPage>mxPage || iPage<2 ){
          rc = SQLITE_CORRUPT_PGNO(iTrunk);
          goto end_allocate_page;
        }
        testcase( iPage==mxPage );
        if( !searchList
         || (iPage==nearby || (iPage<nearby && eMode==BTALLOC_LE))
        ){
          int noContent;
          *pPgno = iPage;
          TRACE(("ALLOCATE: %d was leaf %d of %d on trunk %d"
                 ": %d more free pages\n",
                 *pPgno, closest+1, k, pTrunk->pgno, n-1));
          rc = sqlite3PagerWrite(pTrunk->pDbPage);
          if( rc ) goto end_allocate_page;
          if( closest<k-1 ){
            memcpy(&aData[8+closest*4], &aData[4+k*4], 4);
          }
          put4byte(&aData[4], k-1);
          noContent = !btreeGetHasContent(pBt, *pPgno)? PAGER_GET_NOCONTENT : 0;
          rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, noContent);
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerWrite((*ppPage)->pDbPage);
            if( rc!=SQLITE_OK ){
              releasePage(*ppPage);
              *ppPage = 0;
            }
          }
          searchList = 0;
        }
      }
      releasePage(pPrevTrunk);
      pPrevTrunk = 0;
    }while( searchList );
  }else{
    /* There are no pages on the freelist, so append a new page to the
    ** database image.
    **
    ** Normally, new pages allocated by this block can be requested from the
    ** pager layer with the 'no-content' flag set. This prevents the pager
    ** from trying to read the pages content from disk. However, if the
    ** current transaction has already run one or more incremental-vacuum
    ** steps, then the page we are about to allocate may contain content
    ** that is required in the event of a rollback. In this case, do
    ** not set the no-content flag. This causes the pager to load and journal
    ** the current page content before overwriting it.
    **
    ** Note that the pager will not actually attempt to load or journal
    ** content for any page that really does lie past the end of the database
    ** file on disk. So the effects of disabling the no-content optimization
    ** here are confined to those pages that lie between the end of the
    ** database image and the end of the database file.
    */
    int bNoContent = (0==IfNotOmitAV(pBt->bDoTruncate))? PAGER_GET_NOCONTENT:0;

    rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
    if( rc ) return rc;
    pBt->nPage++;
    if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ) pBt->nPage++;

#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && PTRMAP_ISPAGE(pBt, pBt->nPage) ){
      /* If *pPgno refers to a pointer-map page, allocate two new pages
      ** at the end of the file instead of one. The first allocated page
      ** becomes a new pointer-map page, the second is used by the caller.
      */
      MemPage *pPg = 0;
      TRACE(("ALLOCATE: %d from end of file (pointer-map page)\n", pBt->nPage));
      assert( pBt->nPage!=PENDING_BYTE_PAGE(pBt) );
      rc = btreeGetUnusedPage(pBt, pBt->nPage, &pPg, bNoContent);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pPg->pDbPage);
        releasePage(pPg);
      }
      if( rc ) return rc;
      pBt->nPage++;
      if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ){ pBt->nPage++; }
    }
#endif
    put4byte(28 + (u8*)pBt->pPage1->aData, pBt->nPage);
    *pPgno = pBt->nPage;

    assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );
    rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, bNoContent);
    if( rc ) return rc;
    rc = sqlite3PagerWrite((*ppPage)->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(*ppPage);
      *ppPage = 0;
    }
    TRACE(("ALLOCATE: %d from end of file\n", *pPgno));
  }

  assert( CORRUPT_DB || *pPgno!=PENDING_BYTE_PAGE(pBt) );

end_allocate_page:
  releasePage(pTrunk);
  releasePage(pPrevTrunk);
  assert( rc!=SQLITE_OK || sqlite3PagerPageRefcount((*ppPage)->pDbPage)<=1 );
  assert( rc!=SQLITE_OK || (*ppPage)->isInit==0 );
  return rc;
}